

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpdf_font_cid.c
# Opt level: O1

char * UINT16ToHex(char *s,HPDF_UINT16 val,char *eptr,HPDF_BYTE width)

{
  byte bVar1;
  char cVar2;
  char cVar3;
  char *pcVar4;
  HPDF_BYTE b [2];
  HPDF_UINT16 val2;
  undefined2 local_1e;
  HPDF_UINT16 local_1c;
  ushort local_1a;
  
  if (6 < (long)eptr - (long)s) {
    local_1c = val;
    HPDF_MemCpy((HPDF_BYTE *)&local_1e,(HPDF_BYTE *)&local_1c,2);
    local_1a = local_1e << 8 | local_1e >> 8;
    HPDF_MemCpy((HPDF_BYTE *)&local_1e,(HPDF_BYTE *)&local_1a,2);
    *s = '<';
    if (width == '\x02') {
      cVar3 = ((byte)local_1e >> 4) + 0x37;
      if ((byte)local_1e < 0xa0) {
        cVar3 = ((byte)local_1e >> 4) + 0x30;
      }
      s[1] = cVar3;
      bVar1 = (byte)local_1e & 0xf;
      cVar3 = bVar1 + 0x37;
      if (bVar1 < 10) {
        cVar3 = bVar1 + 0x30;
      }
      s[2] = cVar3;
      pcVar4 = s + 3;
    }
    else {
      pcVar4 = s + 1;
    }
    cVar3 = (local_1e._1_1_ >> 4) + 0x37;
    if (local_1e._1_1_ < 0xa0) {
      cVar3 = (local_1e._1_1_ >> 4) + 0x30;
    }
    local_1e._1_1_ = local_1e._1_1_ & 0xf;
    cVar2 = local_1e._1_1_ + 0x37;
    if (local_1e._1_1_ < 10) {
      cVar2 = local_1e._1_1_ + 0x30;
    }
    *pcVar4 = cVar3;
    pcVar4[1] = cVar2;
    pcVar4[2] = '>';
    pcVar4[3] = '\0';
    s = pcVar4 + 3;
  }
  return s;
}

Assistant:

static char*
UINT16ToHex  (char        *s,
              HPDF_UINT16  val,
              char        *eptr,
              HPDF_BYTE    width)
{
    HPDF_BYTE b[2];
    HPDF_UINT16 val2;
    char c;

    if (eptr - s < 7)
        return s;

    /* align byte-order */
    HPDF_MemCpy (b, (HPDF_BYTE *)&val, 2);
    val2 = (HPDF_UINT16)((HPDF_UINT16)b[0] << 8 | (HPDF_UINT16)b[1]);

    HPDF_MemCpy (b, (HPDF_BYTE *)&val2, 2);

    *s++ = '<';

    /*
     * In principle a range of <00> - <1F> can now not be
     * distinguished from <0000> - <001F>..., this seems something
     * that is wrong with CID ranges. For the UCS-2 encoding we need
     * to add <0000> - <FFFF> and this cannot be <00> - <FFFF> (or at
     * least, that crashes Mac OSX Preview).
     */
    if (width == 2) {
        c = b[0] >> 4;
        if (c <= 9)
            c += 0x30;
        else
            c += 0x41 - 10;
        *s++ = c;

        c = (char)(b[0] & 0x0f);
        if (c <= 9)
            c += 0x30;
        else
            c += 0x41 - 10;
        *s++ = c;
    }

    c = (char)(b[1] >> 4);
    if (c <= 9)
        c += 0x30;
    else
        c += 0x41 - 10;
    *s++ = c;

    c = (char)(b[1] & 0x0f);
    if (c <= 9)
        c += 0x30;
    else
        c += 0x41 - 10;
    *s++ = c;

    *s++ = '>';
    *s = 0;

    return s;
}